

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void save_regions(memfile *mf,level *lev)

{
  region *prVar1;
  xchar xVar2;
  size_t sVar3;
  uint num;
  long lVar4;
  long lVar5;
  uint num_00;
  long lVar6;
  
  xVar2 = ledger_no(&lev->z);
  mtag(mf,(long)xVar2,MTAG_REGION);
  mfmagic_set(mf,0x49474552);
  mwrite32(mf,moves);
  mwrite32(mf,lev->n_regions);
  if (0 < lev->n_regions) {
    lVar5 = 0;
    do {
      prVar1 = lev->regions[lVar5];
      mwrite(mf,&prVar1->bounding_box,4);
      mwrite32(mf,prVar1->attach_2_m);
      mwrite32(mf,prVar1->effect_id);
      mwrite32(mf,prVar1->arg);
      mwrite16(mf,prVar1->nrects);
      if (0 < prVar1->nrects) {
        lVar6 = 0;
        lVar4 = 0;
        do {
          mwrite(mf,&prVar1->rects->lx + lVar6,4);
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar4 < prVar1->nrects);
      }
      mwrite16(mf,prVar1->ttl);
      mwrite16(mf,prVar1->expire_f);
      mwrite16(mf,prVar1->can_enter_f);
      mwrite16(mf,prVar1->enter_f);
      mwrite16(mf,prVar1->can_leave_f);
      mwrite16(mf,prVar1->leave_f);
      mwrite16(mf,prVar1->inside_f);
      mwrite16(mf,prVar1->n_monst);
      mwrite8(mf,prVar1->player_flags);
      mwrite8(mf,prVar1->attach_2_u);
      mwrite8(mf,prVar1->visible);
      if (0 < prVar1->n_monst) {
        lVar4 = 0;
        do {
          mwrite32(mf,prVar1->monsters[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < prVar1->n_monst);
      }
      num_00 = 0;
      num = 0;
      if (prVar1->enter_msg != (char *)0x0) {
        sVar3 = strlen(prVar1->enter_msg);
        num = (int)sVar3 + 1;
      }
      mwrite16(mf,(int16_t)num);
      if (prVar1->leave_msg != (char *)0x0) {
        sVar3 = strlen(prVar1->leave_msg);
        num_00 = (int)sVar3 + 1;
      }
      mwrite16(mf,(int16_t)num_00);
      if (num != 0) {
        mwrite(mf,prVar1->enter_msg,num);
      }
      if (num_00 != 0) {
        mwrite(mf,prVar1->leave_msg,num_00);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < lev->n_regions);
  }
  return;
}

Assistant:

void save_regions(struct memfile *mf, struct level *lev)
{
    int i, j;
    unsigned len1, len2;
    struct region *r;

    mtag(mf, ledger_no(&lev->z), MTAG_REGION);
    mfmagic_set(mf, REGION_MAGIC);
    mwrite32(mf, moves);	/* timestamp */
    mwrite32(mf, lev->n_regions);

    /*
     * Note: level regions don't have ID numbers, so we can't tag
     * individual regions; instead, diff efficiency depends on the
     * fact that regions tend to stay in the order and are typically
     * inserted or deleted near the end of the list.
     */
    for (i = 0; i < lev->n_regions; i++) {
	r = lev->regions[i];

	mwrite(mf, &r->bounding_box, sizeof (struct nhrect));
	mwrite32(mf, r->attach_2_m);
	mwrite32(mf, r->effect_id);
	mwrite32(mf, r->arg);
	mwrite16(mf, r->nrects);
	for (j = 0; j < r->nrects; j++)
	    mwrite(mf, &r->rects[j], sizeof (struct nhrect));
	mwrite16(mf, r->ttl);
	mwrite16(mf, r->expire_f);
	mwrite16(mf, r->can_enter_f);
	mwrite16(mf, r->enter_f);
	mwrite16(mf, r->can_leave_f);
	mwrite16(mf, r->leave_f);
	mwrite16(mf, r->inside_f);
	mwrite16(mf, r->n_monst);
	mwrite8(mf, r->player_flags);
	mwrite8(mf, r->attach_2_u);
	mwrite8(mf, r->visible);

	for (j = 0; j < r->n_monst; j++)
	    mwrite32(mf, r->monsters[j]);

	len1 = r->enter_msg ? strlen(r->enter_msg) + 1 : 0;
	mwrite16(mf, len1);
	len2 = r->leave_msg ? strlen(r->leave_msg) + 1 : 0;
	mwrite16(mf, len2);

	if (len1 > 0)
	    mwrite(mf, r->enter_msg, len1);

	if (len2 > 0)
	    mwrite(mf, r->leave_msg, len2);
    }
}